

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorImpl<unsigned_short>::resize(SmallVectorImpl<unsigned_short> *this,size_type N)

{
  ulong uVar1;
  
  if (*(uint *)(this + 8) <= N) {
    if (N <= *(uint *)(this + 8)) {
      return;
    }
    if (*(uint *)(this + 0xc) < N) {
      SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 0x10,N,2);
    }
    uVar1 = (ulong)*(uint *)(this + 8);
    if (uVar1 != N) {
      memset((void *)(*(long *)this + uVar1 * 2),0,N * 2 + uVar1 * -2);
    }
  }
  if (N <= *(uint *)(this + 0xc)) {
    *(int *)(this + 8) = (int)N;
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void resize(size_type N) {
    if (N < this->size()) {
      this->destroy_range(this->begin()+N, this->end());
      this->set_size(N);
    } else if (N > this->size()) {
      if (this->capacity() < N)
        this->grow(N);
      for (auto I = this->end(), E = this->begin() + N; I != E; ++I)
        new (&*I) T();
      this->set_size(N);
    }
  }